

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

int __thiscall ncnn::Clip::forward_inplace(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  Option *in_RDX;
  Mat *in_RSI;
  Clip *in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float *in_stack_ffffffffffffff60;
  int local_90;
  Mat local_80;
  float *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  if (in_RSI->elemsize == 1) {
    local_4 = forward_inplace_int8(in_RDI,in_RSI,in_RDX);
  }
  else {
    local_24 = in_RSI->w;
    local_28 = in_RSI->h;
    local_2c = in_RSI->c;
    local_30 = local_24 * local_28;
    for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 1) {
      Mat::channel((Mat *)in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      in_stack_ffffffffffffff60 = Mat::operator_cast_to_float_(&local_80);
      Mat::~Mat((Mat *)0x1c6531);
      for (local_90 = 0; local_90 < local_30; local_90 = local_90 + 1) {
        if (in_stack_ffffffffffffff60[local_90] < in_RDI->min) {
          in_stack_ffffffffffffff60[local_90] = in_RDI->min;
        }
        if (in_RDI->max <= in_stack_ffffffffffffff60[local_90] &&
            in_stack_ffffffffffffff60[local_90] != in_RDI->max) {
          in_stack_ffffffffffffff60[local_90] = in_RDI->max;
        }
      }
      local_40 = in_stack_ffffffffffffff60;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Clip::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (bottom_top_blob.elemsize == 1u)
    {
        return Clip::forward_inplace_int8(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < min)
                ptr[i] = min;
            if (ptr[i] > max)
                ptr[i] = max;
        }
    }

    return 0;
}